

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<float,4>>
          (BasicAllFormatsLoad *this,GLenum internalformat,Vector<float,_4> *value,
          Vector<float,_4> *expected_value)

{
  CallLogWrapper *this_00;
  uint uVar1;
  bool bVar2;
  GLuint program;
  uint unit;
  GLint location;
  ostream *poVar3;
  GLenum e;
  GLenum e_00;
  char *pcVar4;
  int h;
  vec4 *expected;
  GLuint texture;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  char *local_208 [4];
  string local_1e8;
  string local_1c8;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar3 = std::operator<<((ostream *)&os,
                           "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            ((string *)&data,(void *)(ulong)internalformat,e);
  poVar3 = std::operator<<(poVar3,(string *)&data);
  pcVar4 = ") readonly uniform ";
  poVar3 = std::operator<<(poVar3,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&texture,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&texture);
  pcVar4 = "image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  ";
  poVar3 = std::operator<<(poVar3,
                           "image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_1c8,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
  pcVar4 = "vec4 v = imageLoad(g_image, coord);\n  if (v != ";
  poVar3 = std::operator<<(poVar3,"vec4 v = imageLoad(g_image, coord);\n  if (v != ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_1e8,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  poVar3 = std::operator<<(poVar3,"vec4");
  poVar3 = tcu::operator<<(poVar3,expected_value);
  std::operator<<(poVar3,
                  ") o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  else o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
                 );
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&texture);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  program = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)this,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,local_208[0],(bool *)0x0);
  std::__cxx11::string::~string((string *)local_208);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x100,value,(allocator_type *)&os);
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,1,&texture);
  uVar1 = 0;
  do {
    unit = uVar1;
    if (unit == 8) {
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
LAB_00a2d5c2:
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return 7 < unit;
    }
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,internalformat,0x10,0x10,0,0x1908,0x1406,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glUseProgram(this_00,program);
    h = 0;
    expected = (vec4 *)0x0;
    glu::CallLogWrapper::glBindImageTexture(this_00,unit,texture,0,'\0',0,35000,internalformat);
    glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this + 0x28));
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x3f80000000000000;
    os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0x3f80000000000000;
    bVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
                      ((ShaderImageLoadStoreBase *)this,0x10,0x10,(int)&os,h,expected);
    if (!bVar2) {
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                ((string *)&os,(void *)(ulong)internalformat,e_00);
      gl4cts::anon_unknown_0::Output
                ("Bad load value. Format is: %s. Unit is: %d.\n",
                 os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                 (ulong)unit);
      std::__cxx11::string::~string((string *)&os);
      goto LAB_00a2d5c2;
    }
    uVar1 = 8;
    if (unit != 7) {
      location = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image");
      glu::CallLogWrapper::glUniform1i(this_00,location,unit + 1);
      uVar1 = unit + 1;
    }
  } while( true );
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint   program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS(internalformat, expected_value).c_str());
		const int	  kSize   = 16;
		std::vector<T> data(kSize * kSize, value);
		GLuint		   texture;
		glGenTextures(1, &texture);

		for (GLuint unit = 0; unit < 8; ++unit)
		{
			glBindTexture(GL_TEXTURE_2D, texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);

			glViewport(0, 0, kSize, kSize);
			glClear(GL_COLOR_BUFFER_BIT);
			glUseProgram(program);
			glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
			glBindVertexArray(m_vao);
			glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

			if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
			{
				glDeleteTextures(1, &texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Bad load value. Format is: %s. Unit is: %d.\n", FormatEnumToString(internalformat).c_str(),
					   unit);
				return false;
			}

			if (unit < 7)
			{
				glUniform1i(glGetUniformLocation(program, "g_image"), static_cast<GLint>(unit + 1));
			}
		}

		glDeleteTextures(1, &texture);
		glUseProgram(0);
		glDeleteProgram(program);

		return true;
	}